

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O2

bool leccalc::setupoutputfiles
               (FILE **fout,bool ordFlag,bool *outputFlags,bool skipheader,
               vector<int,_std::allocator<int>_> *fileIDs_occ,
               vector<int,_std::allocator<int>_> *fileIDs_agg,aggreports *agg)

{
  undefined1 uVar1;
  FILE *__stream;
  size_t sVar2;
  pointer piVar3;
  int *piVar4;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  bool hasEPT;
  vector<int,_std::allocator<int>_> fileIDs_psept;
  string fileHeader_ept;
  string fileHeader_psept;
  vector<int,_std::allocator<int>_> fileIDs;
  vector<int,_std::allocator<int>_> handles_psept;
  vector<int,_std::allocator<int>_> handles_occ;
  vector<int,_std::allocator<int>_> handles_agg;
  
  hasEPT = false;
  fileHeader_ept._M_dataplus._M_p = (pointer)0x200000000;
  fileHeader_ept._M_string_length = CONCAT44(fileHeader_ept._M_string_length._4_4_,3);
  __l._M_len = 3;
  __l._M_array = (iterator)&fileHeader_ept;
  std::vector<int,_std::allocator<int>_>::vector
            (&handles_agg,__l,(allocator_type *)&fileHeader_psept);
  getfileids(fout,&handles_agg,ordFlag,outputFlags,fileIDs_agg,&hasEPT);
  fileHeader_ept._M_dataplus._M_p = (pointer)0x600000004;
  fileHeader_ept._M_string_length = CONCAT44(fileHeader_ept._M_string_length._4_4_,7);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&fileHeader_ept;
  std::vector<int,_std::allocator<int>_>::vector
            (&handles_occ,__l_00,(allocator_type *)&fileHeader_psept);
  getfileids(fout,&handles_occ,ordFlag,outputFlags,fileIDs_occ,&hasEPT);
  fileHeader_ept._M_dataplus._M_p = (pointer)0x500000001;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&fileHeader_ept;
  std::vector<int,_std::allocator<int>_>::vector
            (&handles_psept,__l_01,(allocator_type *)&fileHeader_psept);
  fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (; handles_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_start !=
         handles_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_finish;
      handles_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = handles_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
    if (outputFlags
        [*handles_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start] == true) {
      std::vector<int,_std::allocator<int>_>::push_back
                (&fileIDs_psept,
                 handles_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
  }
  if ((fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish !=
       fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start && ordFlag) &&
     (fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start, fout[1] != (FILE *)0x0)) {
    fileHeader_ept._M_dataplus._M_p._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&fileIDs_psept,(int *)&fileHeader_ept)
    ;
  }
  if (((long)(fileIDs_agg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(fileIDs_agg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start >> 2) +
      ((long)(fileIDs_occ->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(fileIDs_occ->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start >> 2) == 0) {
    if (fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) goto LAB_0010388a;
    if (ordFlag) goto LAB_0010385c;
  }
  else {
    if (ordFlag) {
      aggreports::SetORDOutputFunc(agg,0);
      if (fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_0010388a;
LAB_0010385c:
      aggreports::SetORDOutputFunc(agg,1);
      goto LAB_0010388a;
    }
    aggreports::SetLegacyOutputFunc(agg,0);
    if (fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) goto LAB_0010388a;
  }
  aggreports::SetLegacyOutputFunc(agg,1);
LAB_0010388a:
  uVar1 = hasEPT;
  if (!skipheader) {
    fileHeader_ept._M_dataplus._M_p = (pointer)&fileHeader_ept.field_2;
    fileHeader_ept._M_string_length = 0;
    fileHeader_psept._M_dataplus._M_p = (pointer)&fileHeader_psept.field_2;
    fileHeader_psept._M_string_length = 0;
    fileHeader_ept.field_2._M_local_buf[0] = '\0';
    fileHeader_psept.field_2._M_local_buf[0] = '\0';
    if (ordFlag) {
      std::__cxx11::string::assign((char *)&fileHeader_ept);
      std::__cxx11::string::assign((char *)&fileHeader_psept);
    }
    else {
      std::__cxx11::string::assign((char *)&fileHeader_ept);
      std::__cxx11::string::assign((char *)&fileHeader_psept);
      __stream = fopen("input/ensemble.bin","rb");
      if (__stream != (FILE *)0x0) {
        sVar2 = fread(&fileIDs,8,1,__stream);
        if (sVar2 != 0) {
          std::__cxx11::string::append((char *)&fileHeader_ept);
          std::__cxx11::string::append((char *)&fileHeader_psept);
        }
        fclose(__stream);
      }
    }
    fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::
    __set_union<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((fileIDs_agg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (fileIDs_agg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               (fileIDs_occ->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (fileIDs_occ->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    for (piVar3 = fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar4 = fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        piVar3 != fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
      fprintf((FILE *)fout[*piVar3],"%s\n",fileHeader_ept._M_dataplus._M_p);
    }
    for (; uVar1 = hasEPT,
        piVar4 != fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar4 = piVar4 + 1) {
      fprintf((FILE *)fout[*piVar4],"%s\n",fileHeader_psept._M_dataplus._M_p);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&fileIDs.super__Vector_base<int,_std::allocator<int>_>);
    std::__cxx11::string::~string((string *)&fileHeader_psept);
    std::__cxx11::string::~string((string *)&fileHeader_ept);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&handles_psept.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&handles_occ.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&handles_agg.super__Vector_base<int,_std::allocator<int>_>);
  return (bool)uVar1;
}

Assistant:

inline bool setupoutputfiles(FILE **fout, const bool ordFlag,
				     const bool *outputFlags,
				     const bool skipheader,
				     std::vector<int> &fileIDs_occ,
				     std::vector<int> &fileIDs_agg,
				     aggreports &agg)
	{
		bool hasEPT = false;

		// Get list of aggregate and occurrence output files
		const std::vector<int> handles_agg = { AGG_FULL_UNCERTAINTY,
						       AGG_SAMPLE_MEAN,
						       AGG_WHEATSHEAF_MEAN };
		getfileids(fout, handles_agg, ordFlag, outputFlags,
			   fileIDs_agg, hasEPT);

		const std::vector<int> handles_occ = { OCC_FULL_UNCERTAINTY,
						       OCC_SAMPLE_MEAN,
						       OCC_WHEATSHEAF_MEAN };
		getfileids(fout, handles_occ, ordFlag, outputFlags,
			   fileIDs_occ, hasEPT);

		const std::vector<int> handles_psept = { AGG_WHEATSHEAF,
							 OCC_WHEATSHEAF };
		std::vector<int> fileIDs_psept;
		for (auto it = handles_psept.begin(); it != handles_psept.end();
		     ++it) {
			if (outputFlags[*it]) fileIDs_psept.push_back(*it);
		}
		if (fileIDs_psept.size() > 0 && ordFlag) {
			fileIDs_psept.clear();
			if (fout[PSEPT] != nullptr)
				fileIDs_psept.push_back(PSEPT);
		}

		// Set write csv functions
		if ((fileIDs_occ.size() + fileIDs_agg.size()) > 0) {
			if (ordFlag) agg.SetORDOutputFunc(EPT);
			else agg.SetLegacyOutputFunc(EPT);
		}
		if (fileIDs_psept.size() > 0) {
			if (ordFlag) agg.SetORDOutputFunc(PSEPT);
			else agg.SetLegacyOutputFunc(PSEPT);
		}

		if (skipheader) return hasEPT;   // No header

		// Set file headers
		std::string fileHeader_ept;
		std::string fileHeader_psept;
		if (ordFlag) {
			fileHeader_ept = "SummaryId,EPCalc,EPType,ReturnPeriod,"
					 "Loss";
			fileHeader_psept = "SummaryId,SampleId,EPType,"
					   "ReturnPeriod,Loss";
		} else {
			fileHeader_ept = "summary_id,type,return_period,loss";
			fileHeader_psept = "summary_id,sidx,return_period,loss";
			FILE *fin = fopen(ENSEMBLE_FILE, "rb");
			if (fin != nullptr) {
				Ensemble e;
				// If there is at least one entry
				if (fread(&e, sizeof(Ensemble), 1, fin) != 0) {
					fileHeader_ept += ",ensemble_id";
					fileHeader_psept += ",ensemble_id";
				}
				fclose(fin);
			}
		}

		// Print headers for Exceedance Probability Table
		// (i.e. full uncertainty, sample mean and Wheatsheaf mean)
		std::vector<int> fileIDs;
		std::set_union(fileIDs_agg.begin(), fileIDs_agg.end(),
			       fileIDs_occ.begin(), fileIDs_occ.end(),
			       std::back_inserter(fileIDs));
		for (auto it = fileIDs.begin(); it != fileIDs.end(); ++it) {
			fprintf(fout[*it], "%s\n", fileHeader_ept.c_str());
		}

		// Print headers for Per Sample Exceedance Probability Table
		// (i.e. Wheatsheaf)
		for (auto it = fileIDs_psept.begin(); it != fileIDs_psept.end();
		     ++it) {
			fprintf(fout[*it], "%s\n", fileHeader_psept.c_str());
		}

		return hasEPT;
	}